

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS
ref_cavity_form_insert
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect,
          REF_INT faceid)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT *pRVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  REF_STATUS RVar8;
  REF_INT *pRVar9;
  long lVar10;
  int iVar11;
  undefined8 uVar12;
  REF_INT RVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  iVar7 = ref_node->ref_mpi->id;
  if ((iVar7 == ref_node->part[node]) && (iVar7 == ref_node->part[site])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      pRVar1 = ref_grid->cell[3];
      uVar15 = 0xffffffff;
      RVar13 = -1;
      if (-1 < site) {
        pRVar2 = pRVar1->ref_adj;
        uVar15 = 0xffffffff;
        RVar13 = -1;
        if (site < pRVar2->nnode) {
          uVar6 = pRVar2->first[site];
          uVar15 = 0xffffffff;
          RVar13 = -1;
          if ((long)(int)uVar6 != -1) {
            RVar13 = pRVar2->item[(int)uVar6].ref;
            uVar15 = (ulong)uVar6;
          }
        }
      }
      while ((int)uVar15 != -1) {
        iVar7 = pRVar1->node_per;
        lVar10 = 0;
        iVar11 = 0;
        if (0 < iVar7) {
          iVar11 = iVar7;
        }
        bVar17 = false;
        for (; lVar16 = (long)RVar13, iVar11 != (int)lVar10; lVar10 = lVar10 + 1) {
          bVar5 = !bVar17;
          bVar17 = true;
          if (bVar5) {
            bVar17 = pRVar1->c2n[pRVar1->size_per * lVar16 + lVar10] == protect;
          }
        }
        if ((!bVar17) &&
           ((faceid == -1 || (pRVar1->c2n[pRVar1->size_per * RVar13 + iVar7] == faceid)))) {
          uVar6 = ref_list_contains(ref_cavity->tri_list,RVar13,&already_have_it);
          if (uVar6 != 0) {
            pcVar14 = "have tet?";
            uVar12 = 0x39d;
            goto LAB_001a4d16;
          }
          if (already_have_it != 0) {
            pcVar14 = "added tri twice?";
            uVar12 = 0x39e;
            goto LAB_001a4b25;
          }
          uVar6 = ref_list_push(ref_cavity->tri_list,RVar13);
          if (uVar6 != 0) {
            pcVar14 = "save tri";
            uVar12 = 0x39f;
            goto LAB_001a4d16;
          }
          uVar6 = ref_cell_all_local(pRVar1,ref_node,RVar13,&all_local);
          if (uVar6 != 0) {
            pcVar14 = "local cell";
            uVar12 = 0x3a0;
            goto LAB_001a4d16;
          }
          if (all_local == 0) goto LAB_001a4acc;
          pRVar9 = pRVar1->c2n;
          lVar10 = pRVar1->size_per * lVar16;
          seg_nodes[2] = pRVar9[(long)(int)lVar10 + (long)pRVar1->node_per];
          seg_nodes[0] = pRVar9[lVar10 + 1];
          seg_nodes[1] = pRVar9[lVar10 + 2];
          if (seg_nodes[1] != node && seg_nodes[0] != node) {
            uVar6 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
            if (uVar6 != 0) {
              pcVar14 = "tri side";
              uVar12 = 0x3ab;
              goto LAB_001a4d16;
            }
            pRVar9 = pRVar1->c2n;
            lVar10 = pRVar1->size_per * lVar16;
          }
          seg_nodes[0] = pRVar9[lVar10 + 2];
          seg_nodes[1] = pRVar9[lVar10];
          if (seg_nodes[1] != node && seg_nodes[0] != node) {
            uVar6 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
            if (uVar6 != 0) {
              pcVar14 = "tri side";
              uVar12 = 0x3b1;
              goto LAB_001a4d16;
            }
            pRVar9 = pRVar1->c2n;
            lVar10 = pRVar1->size_per * lVar16;
          }
          seg_nodes[0] = pRVar9[lVar10];
          seg_nodes[1] = pRVar9[lVar10 + 1];
          if ((seg_nodes[1] != node && seg_nodes[0] != node) &&
             (uVar6 = ref_cavity_insert_seg(ref_cavity,seg_nodes), uVar6 != 0)) {
            pcVar14 = "tri side";
            uVar12 = 0x3b7;
            goto LAB_001a4d16;
          }
        }
        pRVar3 = pRVar1->ref_adj->item;
        uVar15 = (ulong)pRVar3[(int)uVar15].next;
        RVar13 = -1;
        if (uVar15 != 0xffffffffffffffff) {
          RVar13 = pRVar3[uVar15].ref;
        }
      }
      pRVar1 = ref_grid->cell[8];
      uVar15 = 0xffffffff;
      RVar13 = -1;
      if (-1 < site) {
        pRVar2 = pRVar1->ref_adj;
        uVar15 = 0xffffffff;
        RVar13 = -1;
        if (site < pRVar2->nnode) {
          uVar6 = pRVar2->first[site];
          uVar15 = 0xffffffff;
          RVar13 = -1;
          if ((long)(int)uVar6 != -1) {
            RVar13 = pRVar2->item[(int)uVar6].ref;
            uVar15 = (ulong)uVar6;
          }
        }
      }
      do {
        if ((int)uVar15 == -1) {
          if (ref_cavity->debug != 0) {
            printf("insert form state %d\n",(ulong)ref_cavity->state);
          }
          RVar8 = ref_cavity_verify_face_manifold(ref_cavity);
          if (RVar8 == 0) {
            if (ref_cavity->debug != 0) {
              printf("insert face manifold state %d\n",(ulong)ref_cavity->state);
            }
            RVar8 = ref_cavity_verify_seg_manifold(ref_cavity);
            if (RVar8 == 0) {
              if (ref_cavity->debug == 0) {
                return 0;
              }
              printf("insert seg manifold state %d\n",(ulong)ref_cavity->state);
              return 0;
            }
            pcVar14 = "ball seg manifold";
            uVar6 = 1;
            uVar12 = 0x3e1;
          }
          else {
            pcVar14 = "ball face manifold";
            uVar6 = 1;
            uVar12 = 0x3dd;
          }
LAB_001a4d16:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar12,"ref_cavity_form_insert",(ulong)uVar6,pcVar14);
          return uVar6;
        }
        lVar10 = 0;
        iVar7 = pRVar1->node_per;
        if (pRVar1->node_per < 1) {
          iVar7 = 0;
        }
        bVar17 = false;
        for (lVar16 = 0; iVar7 != (int)lVar16; lVar16 = lVar16 + 1) {
          bVar5 = !bVar17;
          bVar17 = true;
          if (bVar5) {
            bVar17 = pRVar1->c2n[(long)pRVar1->size_per * (long)RVar13 + lVar16] == protect;
          }
        }
        if (!bVar17) {
          uVar6 = ref_list_contains(ref_cavity->tet_list,RVar13,&already_have_it);
          if (uVar6 != 0) {
            pcVar14 = "have tet?";
            uVar12 = 0x3c6;
            goto LAB_001a4d16;
          }
          if (already_have_it != 0) {
            pcVar14 = "added tet twice?";
            uVar12 = 0x3c7;
LAB_001a4b25:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar12,"ref_cavity_form_insert",pcVar14);
            return 1;
          }
          uVar6 = ref_list_push(ref_cavity->tet_list,RVar13);
          if (uVar6 != 0) {
            pcVar14 = "save tet";
            uVar12 = 0x3c8;
            goto LAB_001a4d16;
          }
          uVar6 = ref_cell_all_local(pRVar1,ref_node,RVar13,&all_local);
          if (uVar6 != 0) {
            pcVar14 = "local cell";
            uVar12 = 0x3c9;
            goto LAB_001a4d16;
          }
          if (all_local == 0) {
LAB_001a4acc:
            ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
            return 0;
          }
          for (; lVar10 < pRVar1->face_per; lVar10 = lVar10 + 1) {
            pRVar9 = pRVar1->c2n;
            iVar7 = pRVar1->size_per;
            pRVar4 = pRVar1->f2n;
            for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
              face_nodes[lVar16] =
                   pRVar9[(long)pRVar4[(ulong)((uint)lVar10 & 0x3fffffff) * 4 + lVar16] +
                          (long)iVar7 * (long)RVar13];
            }
            if ((((face_nodes[0] != node) && (face_nodes[1] != node)) && (face_nodes[2] != node)) &&
               (uVar6 = ref_cavity_insert_face(ref_cavity,face_nodes), uVar6 != 0)) {
              pcVar14 = "tet side";
              uVar12 = 0x3d6;
              goto LAB_001a4d16;
            }
          }
        }
        pRVar3 = pRVar1->ref_adj->item;
        uVar15 = (ulong)pRVar3[(int)uVar15].next;
        RVar13 = -1;
        if (uVar15 != 0xffffffffffffffff) {
          RVar13 = pRVar3[uVar15].ref;
        }
      } while( true );
    }
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
  }
  else {
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert(REF_CAVITY ref_cavity,
                                          REF_GRID ref_grid, REF_INT node,
                                          REF_INT site, REF_INT protect,
                                          REF_INT faceid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    /* only insert tri with faceid if not empty */
    if (REF_EMPTY != faceid &&
        faceid != ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell))
      continue;
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  if (ref_cavity_debug(ref_cavity))
    printf("insert form state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert face manifold state %d\n",
           (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert seg manifold state %d\n", (int)ref_cavity_state(ref_cavity));

  return REF_SUCCESS;
}